

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O0

void and_or_test(void)

{
  uint16_t pos;
  int iVar1;
  bitset_container_t *bitset;
  bitset_container_t *bitset_00;
  bitset_container_t *bitset_01;
  bitset_container_t *pbVar2;
  _Bool ini;
  _Bool in2;
  _Bool in1;
  size_t x_4;
  int interc;
  int card_inter;
  int card_union;
  size_t x_3;
  int bo_count;
  size_t x_2;
  int b2_count;
  size_t x_1;
  size_t x;
  int bi_count;
  int b1_count;
  size_t max_value;
  bitset_container_t *BO;
  bitset_container_t *BI;
  bitset_container_t *B2;
  bitset_container_t *B1;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff84;
  byte in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  bitset_container_t *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar3;
  bitset_container_t *v;
  ulong local_50;
  ulong local_40;
  ulong local_38;
  
  bitset = bitset_container_create();
  bitset_00 = bitset_container_create();
  bitset_01 = bitset_container_create();
  pbVar2 = bitset_container_create();
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7c);
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7c);
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7c);
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7c);
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7c);
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7c);
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7c);
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7c);
  for (local_38 = 0; local_38 < 60000; local_38 = local_38 + 3) {
    bitset_container_set(bitset,(uint16_t)local_38);
    bitset_container_set(bitset_01,(uint16_t)local_38);
  }
  for (local_40 = 0; local_40 < 60000; local_40 = local_40 + 3) {
    bitset_container_get(bitset,(uint16_t)local_40);
    _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (char *)in_stack_ffffffffffffff88,
                 (char *)CONCAT17(in_stack_ffffffffffffff87,
                                  CONCAT16(in_stack_ffffffffffffff86,
                                           CONCAT15(in_stack_ffffffffffffff85,
                                                    CONCAT14(in_stack_ffffffffffffff84,
                                                             in_stack_ffffffffffffff80)))),
                 in_stack_ffffffffffffff7c);
    bitset_container_get(bitset_01,(uint16_t)local_40);
    _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (char *)in_stack_ffffffffffffff88,
                 (char *)CONCAT17(in_stack_ffffffffffffff87,
                                  CONCAT16(in_stack_ffffffffffffff86,
                                           CONCAT15(in_stack_ffffffffffffff85,
                                                    CONCAT14(in_stack_ffffffffffffff84,
                                                             in_stack_ffffffffffffff80)))),
                 in_stack_ffffffffffffff7c);
  }
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7c);
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7c);
  for (local_50 = 0; local_50 < 60000; local_50 = local_50 + 0x3e) {
    pos = (uint16_t)local_50;
    bitset_container_get(bitset_01,pos);
    bitset_container_set(bitset_00,pos);
    bitset_container_set(bitset_01,pos);
  }
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7c);
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7c);
  for (v = (bitset_container_t *)0x0; v < (bitset_container_t *)0xea60;
      v = (bitset_container_t *)((long)&v[0xb].words + 2)) {
    bitset_container_set(pbVar2,(uint16_t)v);
  }
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7c);
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7c);
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7c);
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7c);
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))),
               in_stack_ffffffffffffff7c);
  iVar1 = bitset_container_compute_cardinality
                    ((bitset_container_t *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,iVar1)))),
               in_stack_ffffffffffffff7c);
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,iVar1)))),
               in_stack_ffffffffffffff7c);
  bitset_container_printf(v);
  bitset_container_printf(v);
  bitset_container_printf(v);
  bitset_container_andnot_nocard
            (in_stack_ffffffffffffff88,
             (bitset_container_t *)
             CONCAT17(in_stack_ffffffffffffff87,
                      CONCAT16(in_stack_ffffffffffffff86,
                               CONCAT15(in_stack_ffffffffffffff85,
                                        CONCAT14(in_stack_ffffffffffffff84,iVar1)))),
             (bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  bitset_container_printf(v);
  bitset_container_printf(v);
  bitset_container_printf(v);
  iVar3 = 0;
  for (pbVar2 = (bitset_container_t *)0x0; pbVar2 < (bitset_container_t *)0xea60;
      pbVar2 = (bitset_container_t *)((long)&pbVar2->cardinality + 1)) {
    in_stack_ffffffffffffff87 = bitset_container_get(bitset,(uint16_t)pbVar2);
    in_stack_ffffffffffffff86 = bitset_container_get(bitset_00,(uint16_t)pbVar2);
    in_stack_ffffffffffffff85 = bitset_container_get(bitset_01,(uint16_t)pbVar2);
    _assert_true(CONCAT44(iVar3,in_stack_ffffffffffffff90),(char *)pbVar2,
                 (char *)CONCAT17(in_stack_ffffffffffffff87,
                                  CONCAT16(in_stack_ffffffffffffff86,
                                           CONCAT15(in_stack_ffffffffffffff85,
                                                    CONCAT14(in_stack_ffffffffffffff84,iVar1)))),
                 in_stack_ffffffffffffff7c);
    iVar3 = (uint)(in_stack_ffffffffffffff85 & 1) + iVar3;
  }
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_true(CONCAT44(iVar3,in_stack_ffffffffffffff90),(char *)pbVar2,
               (char *)CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT15(in_stack_ffffffffffffff85,
                                                  CONCAT14(in_stack_ffffffffffffff84,iVar1)))),
               in_stack_ffffffffffffff7c);
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_int_not_equal
            (CONCAT44(iVar3,in_stack_ffffffffffffff90),(unsigned_long)pbVar2,
             (char *)CONCAT17(in_stack_ffffffffffffff87,
                              CONCAT16(in_stack_ffffffffffffff86,
                                       CONCAT15(in_stack_ffffffffffffff85,
                                                CONCAT14(in_stack_ffffffffffffff84,iVar1)))),
             in_stack_ffffffffffffff7c);
  bitset_container_and
            (pbVar2,(bitset_container_t *)
                    CONCAT17(in_stack_ffffffffffffff87,
                             CONCAT16(in_stack_ffffffffffffff86,
                                      CONCAT15(in_stack_ffffffffffffff85,
                                               CONCAT14(in_stack_ffffffffffffff84,iVar1)))),
             (bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_int_not_equal
            (CONCAT44(iVar3,in_stack_ffffffffffffff90),(unsigned_long)pbVar2,
             (char *)CONCAT17(in_stack_ffffffffffffff87,
                              CONCAT16(in_stack_ffffffffffffff86,
                                       CONCAT15(in_stack_ffffffffffffff85,
                                                CONCAT14(in_stack_ffffffffffffff84,iVar1)))),
             in_stack_ffffffffffffff7c);
  bitset_container_or_nocard
            (pbVar2,(bitset_container_t *)
                    CONCAT17(in_stack_ffffffffffffff87,
                             CONCAT16(in_stack_ffffffffffffff86,
                                      CONCAT15(in_stack_ffffffffffffff85,
                                               CONCAT14(in_stack_ffffffffffffff84,iVar1)))),
             (bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  bitset_container_compute_cardinality
            ((bitset_container_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_int_not_equal
            (CONCAT44(iVar3,in_stack_ffffffffffffff90),(unsigned_long)pbVar2,
             (char *)CONCAT17(in_stack_ffffffffffffff87,
                              CONCAT16(in_stack_ffffffffffffff86,
                                       CONCAT15(in_stack_ffffffffffffff85,
                                                CONCAT14(in_stack_ffffffffffffff84,iVar1)))),
             in_stack_ffffffffffffff7c);
  bitset_container_or(pbVar2,(bitset_container_t *)
                             CONCAT17(in_stack_ffffffffffffff87,
                                      CONCAT16(in_stack_ffffffffffffff86,
                                               CONCAT15(in_stack_ffffffffffffff85,
                                                        CONCAT14(in_stack_ffffffffffffff84,iVar1))))
                      ,(bitset_container_t *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  _assert_int_not_equal
            (CONCAT44(iVar3,in_stack_ffffffffffffff90),(unsigned_long)pbVar2,
             (char *)CONCAT17(in_stack_ffffffffffffff87,
                              CONCAT16(in_stack_ffffffffffffff86,
                                       CONCAT15(in_stack_ffffffffffffff85,
                                                CONCAT14(in_stack_ffffffffffffff84,iVar1)))),
             in_stack_ffffffffffffff7c);
  bitset_container_free((bitset_container_t *)0x1033d8);
  bitset_container_free((bitset_container_t *)0x1033e2);
  bitset_container_free((bitset_container_t *)0x1033ec);
  bitset_container_free((bitset_container_t *)0x1033f6);
  return;
}

Assistant:

DEFINE_TEST(and_or_test) {
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* BI = bitset_container_create();
    bitset_container_t* BO = bitset_container_create();
    assert_true(bitset_container_compute_cardinality(B1) == 0);
    assert_true(bitset_container_compute_cardinality(B2) == 0);
    assert_true(bitset_container_compute_cardinality(BI) == 0);
    assert_true(bitset_container_compute_cardinality(BO) == 0);

    assert_non_null(B1);
    assert_non_null(B2);
    assert_non_null(BI);
    assert_non_null(BO);

    size_t max_value = 60000;

    int b1_count = 0;
    int bi_count = 0;
    for (size_t x = 0; x < max_value; x += 3) {
        bitset_container_set(B1, x);
        bitset_container_set(BI, x);
        b1_count++;
        bi_count++;
    }
    for (size_t x = 0; x < max_value; x += 3) {
        assert_true(bitset_container_get(B1, x));
        assert_true(bitset_container_get(BI, x));
    }

    assert_true(bitset_container_compute_cardinality(B1) == b1_count);
    assert_true(bitset_container_compute_cardinality(BI) == bi_count);

    int b2_count = 0;
    // important: 62 is not divisible by 3
    for (size_t x = 0; x < max_value; x += 62) {
        bi_count += !bitset_container_get(BI, x);

        bitset_container_set(B2, x);
        bitset_container_set(BI, x);
        b2_count++;
    }

    assert_true(bitset_container_compute_cardinality(B2) == b2_count);
    assert_true(bitset_container_compute_cardinality(BI) == bi_count);
    int bo_count = 0;
    for (size_t x = 0; x < max_value; x += 62 * 3) {
        bitset_container_set(BO, x);
        bo_count++;
    }

    assert_true(bitset_container_compute_cardinality(BO) == bo_count);
    assert_true(bitset_container_compute_cardinality(BI) == bi_count);
    const int card_union = bitset_container_compute_cardinality(BI);
    const int card_inter = bitset_container_compute_cardinality(BO);
    assert_true(bitset_container_compute_cardinality(BI) == card_union);
    assert_true(bi_count == card_union);
    assert_true(bitset_container_compute_cardinality(BO) == bo_count);
    assert_true(bitset_container_compute_cardinality(BO) ==
                bitset_container_compute_cardinality(BO));
    assert_true(card_inter == bo_count);
    bitset_container_printf(B1);  // does it crash?
    bitset_container_printf(B2);  // does it crash?
    bitset_container_printf(BI);  // does it crash?

    bitset_container_andnot_nocard(B1, B2, BI);

    bitset_container_printf(B1);  // does it crash?
    bitset_container_printf(B2);  // does it crash?
    bitset_container_printf(BI);  // does it crash?
    int interc = 0;
    for (size_t x = 0; x < max_value; x++) {
        bool in1 = bitset_container_get(B1, x);
        bool in2 = bitset_container_get(B2, x);
        bool ini = bitset_container_get(BI, x);
        assert_true(ini == (in1 & !in2));
        interc += ini;
    }
    assert_true(bitset_container_compute_cardinality(BI) == interc);
    assert_int_not_equal(bitset_container_compute_cardinality(BI), card_union);
    assert_int_not_equal(bitset_container_and(B1, B2, BI), card_union);
    bitset_container_or_nocard(B1, B2, BO);
    assert_int_not_equal(bitset_container_compute_cardinality(BO), card_inter);
    assert_int_not_equal(bitset_container_or(B1, B2, BO), card_inter);

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(BI);
    bitset_container_free(BO);
}